

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_not_vec_aarch64(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a)

{
  TCGOpcode *n;
  TCGv_vec b;
  TCGv_vec t;
  TCGOpcode *hold_list;
  TCGv_vec a_local;
  TCGv_vec r_local;
  uint vece_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  n = tcg_swap_vecop_list((TCGOpcode *)0x0);
  b = tcg_const_ones_vec_matching_aarch64(tcg_ctx,r);
  tcg_gen_xor_vec_aarch64(tcg_ctx,0,r,a,b);
  tcg_temp_free_vec(tcg_ctx,b);
  tcg_swap_vecop_list(n);
  return;
}

Assistant:

void tcg_gen_not_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a)
{
    const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);

    if (!TCG_TARGET_HAS_not_vec || !do_op2(tcg_ctx, vece, r, a, INDEX_op_not_vec)) {
        TCGv_vec t = tcg_const_ones_vec_matching(tcg_ctx, r);
        tcg_gen_xor_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}